

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_23::current_seconds_test::current_seconds_test(current_seconds_test *this)

{
  current_seconds_test *this_local;
  
  compile_fixture::compile_fixture(&this->super_compile_fixture);
  (this->super_compile_fixture)._vptr_compile_fixture =
       (_func_int **)&PTR__current_seconds_test_0032e820;
  return;
}

Assistant:

void test()
      {
      uint64_t secondsUTC = std::chrono::duration_cast<std::chrono::seconds>(std::chrono::system_clock::now().time_since_epoch()).count();      

      asmcode code;
      uint64_t res = 0;
      try
        {
        code = get_asmcode("(current-seconds)");
        }
      catch (std::logic_error e)
        {
        std::cout << e.what();
        }
      first_pass_data d;
      uint64_t size;
      fun_ptr f = (fun_ptr)assemble(size, d, code);
      if (f)
        {
        res = f(&ctxt);
        compiled_functions.emplace_back(f, size);
        res >>= 1;
        }
      TEST_ASSERT(secondsUTC <= res);
      secondsUTC = std::chrono::duration_cast<std::chrono::seconds>(std::chrono::system_clock::now().time_since_epoch()).count();
      TEST_ASSERT(res <= secondsUTC);
      }